

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_SourceFeatures_Test::
TestBody(CommandLineInterfaceTest_Plugin_SourceFeatures_Test *this)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  Nonnull<std::string_*> dest;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  pointer pcVar5;
  char *in_R9;
  pointer *__ptr_2;
  Metadata MVar6;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view src;
  string_view data;
  string_view contents;
  string_view contents_00;
  string_view contents_01;
  string_view filename;
  string binary_request;
  string plugin_path;
  CodeGeneratorRequest request;
  string base64_output;
  AssertHelper local_168;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  undefined1 local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  AssertHelper local_130;
  char *local_128;
  size_t local_120;
  char local_118;
  undefined7 uStack_117;
  lts_20250127 *local_108;
  AlphaNum *local_100;
  long local_f8 [2];
  undefined1 local_e8 [72];
  RepeatedPtrFieldBase local_a0;
  string local_78;
  undefined1 local_58 [48];
  
  MVar6 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  FileDescriptor::DebugString_abi_cxx11_((string *)local_e8,(MVar6.descriptor)->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = (char *)local_e8._0_8_;
  contents._M_len = local_e8._8_8_;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  pcVar4 = local_e8 + 0x10;
  if ((char *)local_e8._0_8_ != pcVar4) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  MVar6 = pb::TestFeatures::GetMetadata((TestFeatures *)pb::_TestFeatures_default_instance_);
  FileDescriptor::DebugString_abi_cxx11_((string *)local_e8,(MVar6.descriptor)->file_);
  name_00._M_str = "google/protobuf/unittest_features.proto";
  name_00._M_len = 0x27;
  contents_00._M_str = (char *)local_e8._0_8_;
  contents_00._M_len = local_e8._8_8_;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  if ((char *)local_e8._0_8_ != pcVar4) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  name_01._M_str = "foo.proto";
  name_01._M_len = 9;
  contents_01._M_str =
       "\n    edition = \"2023\";\n    import \"google/protobuf/unittest_features.proto\";\n    package foo;\n    message Foo {\n      int32 b = 1 [\n        features.(pb.test).field_feature = VALUE6,\n        features.(pb.test).source_feature = VALUE5\n      ];\n    }\n  "
  ;
  contents_01._M_len = 0xfb;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_01,contents_01)
  ;
  local_108 = (lts_20250127 *)local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/fake_plugin"
             ,"");
  local_e8._0_8_ = (char *)0x6b;
  local_e8._8_8_ =
       "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir foo.proto --plugin=prefix-gen-fake_plugin="
  ;
  local_58._0_8_ = local_100;
  local_58._8_8_ = local_108;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_78,(lts_20250127 *)local_e8,(AlphaNum *)local_58,local_100);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  filename._M_str = &DAT_00000011;
  filename._M_len =
       (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_.
       _M_string_length;
  dest = (Nonnull<std::string_*>)&DAT_00000011;
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            ((string *)local_58,
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_dataplus._M_p,filename);
  local_120 = 0;
  local_118 = '\0';
  src._M_str = (char *)&local_128;
  src._M_len = local_58._0_8_;
  local_128 = &local_118;
  local_150[0] = (internal)
                 absl::lts_20250127::Base64Unescape((lts_20250127 *)local_58._8_8_,src,dest);
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_150[0]) {
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_150,
               (AssertionResult *)"absl::Base64Unescape(base64_output, &binary_request)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x70e,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((char *)local_e8._0_8_ != pcVar4) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if (local_160._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._M_head_impl + 8))();
    }
    if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_148,local_148);
    }
    goto LAB_00a094b5;
  }
  CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)local_e8,(Arena *)0x0);
  data._M_str = local_128;
  data._M_len = local_120;
  bVar1 = MessageLite::ParseFromString((MessageLite *)local_e8,data);
  local_160._M_head_impl._0_1_ = bVar1;
  local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                       ((RepeatedPtrFieldBase *)(local_e8 + 0x30),2);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
              ((internal *)local_150,"request.proto_file(2).name()","\"foo.proto\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)(pVVar2->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
               (char (*) [10])0x119907e);
    if (local_150[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_160);
      if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar5 = (local_148->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x713,pcVar5);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_160);
LAB_00a0947c:
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      if (local_160._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_160._M_head_impl + 8))();
      }
    }
    else {
      if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_148,local_148);
      }
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         ((RepeatedPtrFieldBase *)(local_e8 + 0x30),2);
      pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(pVVar2->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,0);
      protobuf::internal::RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(pVVar3->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
      local_160._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11956e9;
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
                (local_150,(char *)&local_160,(FeatureSet *)0x1373e84);
      if (local_150[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_160);
        if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar4 = (local_148->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x717,pcVar4);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if (local_160._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_160._M_head_impl + 8))();
        }
      }
      if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_148,local_148);
      }
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         (&local_a0,0);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                ((internal *)local_150,"request.source_file_descriptors(0).name()","\"foo.proto\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(pVVar2->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                 (char (*) [10])0x119907e);
      if (local_150[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_160);
        if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (local_148->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x71b,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_160);
        goto LAB_00a0947c;
      }
      if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_148,local_148);
      }
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         (&local_a0,0);
      pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(pVVar2->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,0);
      protobuf::internal::RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(pVVar3->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
      local_160._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x119570d;
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
                (local_150,(char *)&local_160,(FeatureSet *)0x1373e84);
      if (local_150[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_160);
        if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (local_148->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x724,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_160);
        goto LAB_00a0947c;
      }
    }
    if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_148;
      __ptr_00 = local_148;
LAB_00a094a3:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,__ptr_00);
    }
  }
  else {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_158;
    testing::Message::Message((Message *)&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)&local_160,
               (AssertionResult *)"request.ParseFromString(binary_request)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x710,(char *)CONCAT71(local_150._1_7_,local_150[0]));
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_150._1_7_,local_150[0]) != &local_140) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_150._1_7_,local_150[0]),local_140._M_allocated_capacity + 1)
      ;
    }
    if (local_168.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_168.data_ + 8))();
    }
    __ptr_00 = local_158;
    if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00a094a3;
  }
  CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)local_e8);
LAB_00a094b5:
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  if ((AlphaNum *)local_58._0_8_ != (AlphaNum *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (local_108 != (lts_20250127 *)local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_SourceFeatures) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("google/protobuf/unittest_features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "google/protobuf/unittest_features.proto";
    package foo;
    message Foo {
      int32 b = 1 [
        features.(pb.test).field_feature = VALUE6,
        features.(pb.test).source_feature = VALUE5
      ];
    }
  )schema");

#ifdef GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH
  std::string plugin_path = GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH;
#else
  std::string plugin_path = absl::StrCat(
      TestUtil::TestSourceDir(), "/google/protobuf/compiler/fake_plugin");
#endif

  // Invoke protoc with fake_plugin to get ahold of the CodeGeneratorRequest
  // sent by protoc.
  Run(absl::StrCat(
      "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir "
      "foo.proto --plugin=prefix-gen-fake_plugin=",
      plugin_path));
  ExpectNoErrors();
  std::string base64_output = ReadFile("foo.proto.request");
  std::string binary_request;
  ASSERT_TRUE(absl::Base64Unescape(base64_output, &binary_request));
  CodeGeneratorRequest request;
  ASSERT_TRUE(request.ParseFromString(binary_request));

  {
    ASSERT_EQ(request.proto_file(2).name(), "foo.proto");
    const FeatureSet& features =
        request.proto_file(2).message_type(0).field(0).options().features();
    EXPECT_THAT(features,
                EqualsProto(R"pb([pb.test] { field_feature: VALUE6 })pb"));
  }

  {
    ASSERT_EQ(request.source_file_descriptors(0).name(), "foo.proto");
    const FeatureSet& features = request.source_file_descriptors(0)
                                     .message_type(0)
                                     .field(0)
                                     .options()
                                     .features();
    EXPECT_THAT(features, EqualsProto(R"pb([pb.test] {
                                             field_feature: VALUE6
                                             source_feature: VALUE5
                                           })pb"));
  }
}